

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexec.c
# Opt level: O2

OnigUChar * onig_get_contents_end_by_callout_args(OnigCalloutArgs *args)

{
  CalloutListEntry *pCVar1;
  OnigUChar *pOVar2;
  
  pCVar1 = onig_reg_callout_list_at(args->regex,args->num);
  if ((pCVar1 == (CalloutListEntry *)0x0) || (pCVar1->of != ONIG_CALLOUT_OF_CONTENTS)) {
    pOVar2 = (OnigUChar *)0x0;
  }
  else {
    pOVar2 = (pCVar1->u).content.end;
  }
  return pOVar2;
}

Assistant:

extern const UChar*
onig_get_contents_end_by_callout_args(OnigCalloutArgs* args)
{
  int num;
  CalloutListEntry* e;

  num = args->num;
  e = onig_reg_callout_list_at(args->regex, num);
  if (IS_NULL(e)) return 0;
  if (e->of == ONIG_CALLOUT_OF_CONTENTS) {
    return e->u.content.end;
  }

  return 0;
}